

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)>::Invoke
          (FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this,long args,
          TestValue *args_1)

{
  bool bVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<bool> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  local_38;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  holder;
  ArgumentTuple tuple;
  TestValue *args_local_1;
  long args_local;
  FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this_local;
  
  tuple.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
  super__Head_base<0UL,_long,_false>._M_head_impl = (long)args_1;
  args_local_1 = (TestValue *)args;
  args_local = (long)this;
  std::tuple<long,_(anonymous_namespace)::TestValue_*>::
  tuple<long,_(anonymous_namespace)::TestValue_*,_true>
            ((tuple<long,_(anonymous_namespace)::TestValue_*> *)&holder,(long *)&args_local_1,
             (TestValue **)
             &tuple.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
              super__Head_base<0UL,_long,_false>);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<long,_(anonymous_namespace)::TestValue_*> *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<bool>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<bool>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
              *)&local_38,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
            ::operator->(&local_38);
  bVar1 = ActionResultHolder<bool>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  ::~unique_ptr(&local_38);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }